

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

_Bool consume(ch_compilation *comp,ch_token_kind kind,char *error_message,ch_token *out_token)

{
  _Bool _Var1;
  _Bool result;
  ch_token *out_token_local;
  char *error_message_local;
  ch_token_kind kind_local;
  ch_compilation *comp_local;
  
  _Var1 = opt_consume(comp,kind,out_token);
  if (!_Var1) {
    error(comp,error_message);
  }
  return _Var1;
}

Assistant:

bool consume(ch_compilation *comp, ch_token_kind kind,
             const char *error_message, ch_token *out_token) {
    bool result = opt_consume(comp, kind, out_token);
    if (!result) {
      error(comp, error_message);
    }

    return result;
}